

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O0

void __thiscall
jsonnet::internal::RuntimeError::RuntimeError
          (RuntimeError *this,
          vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
          *stack_trace,string *msg)

{
  string *in_RDX;
  long in_RDI;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
  *in_stack_00000018;
  
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::vector
            ((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
              *)msg,in_stack_00000018);
  std::__cxx11::string::string((string *)(in_RDI + 0x18),in_RDX);
  return;
}

Assistant:

RuntimeError(const std::vector<TraceFrame> stack_trace, const std::string &msg)
        : stackTrace(stack_trace), msg(msg)
    {
    }